

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

Vec3 __thiscall Sphere::GetCenter(Sphere *this,float t)

{
  float fVar1;
  long in_RSI;
  float in_XMM1_Da;
  float fVar2;
  Vec3 VVar3;
  Vec3 VVar4;
  Vec3 local_2c;
  float fVar5;
  
  if ((*(char *)(in_RSI + 0x30) != '\x01') ||
     (in_XMM1_Da = *(float *)(in_RSI + 0x34), t <= in_XMM1_Da)) {
    (this->super_Object)._vptr_Object = *(_func_int ***)(in_RSI + 8);
    VVar3.e[1] = 0.0;
    VVar3.e[0] = *(float *)(in_RSI + 0x10);
    VVar3.e[2] = in_XMM1_Da;
    (this->m_center).e[0] = *(float *)(in_RSI + 0x10);
  }
  else {
    fVar1 = *(float *)(in_RSI + 0x38);
    fVar2 = fVar1;
    if (t <= fVar1) {
      fVar2 = t;
    }
    operator-((Vec3 *)(in_RSI + 0x14),(Vec3 *)(in_RSI + 8));
    operator*((fVar2 - in_XMM1_Da) / (fVar1 - in_XMM1_Da),&local_2c);
    VVar3 = operator+((Vec3 *)(in_RSI + 8),&local_2c);
  }
  VVar4.e[0] = VVar3.e[0];
  VVar4.e[1] = VVar3.e[1];
  register0x00001240 = VVar3.e[2];
  return (Vec3)VVar4.e;
}

Assistant:

Vec3
Sphere::GetCenter(float t) const
{
    return (!m_animated || (t <= m_animation_start)) ? m_center :
    m_center + ((std::min(t, m_animation_end) - m_animation_start)/(m_animation_end - m_animation_start)) * (m_center_end - m_center);
}